

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O2

int ply_add_scalar_property(p_ply ply,char *name,e_ply_type type)

{
  size_t sVar1;
  p_ply_property __dest;
  int iVar2;
  
  sVar1 = strlen(name);
  if (((int)type < 0x10) && (sVar1 < 0x100)) {
    __dest = ply_grow_property(ply,ply->element + ply->nelements + -1);
    if (__dest == (p_ply_property)0x0) {
      iVar2 = 0;
    }
    else {
      strcpy(__dest->name,name);
      __dest->type = type;
      iVar2 = 1;
    }
  }
  else {
    iVar2 = 0;
    ply_ferror(ply,"Invalid arguments");
  }
  return iVar2;
}

Assistant:

int ply_add_scalar_property(p_ply ply, const char *name, e_ply_type type) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(name && strlen(name) < WORDSIZE);
    assert(type < PLY_LIST);
    if (strlen(name) >= WORDSIZE || type >= PLY_LIST) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    element = &ply->element[ply->nelements - 1];
    property = ply_grow_property(ply, element);
    if (!property) return 0;
    strcpy(property->name, name);
    property->type = type;
    return 1;
}